

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O3

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rowIdx,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rows_to_combine_rate_adapt,
          uint initial_row_combs)

{
  uint uVar1;
  uint *puVar2;
  pointer puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  uint *puVar4;
  ulong uVar5;
  domain_error *this_00;
  uint *puVar6;
  uint uVar7;
  bool bVar8;
  
  puVar4 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = puVar4 + 1;
  if (puVar6 != puVar2 && puVar4 != puVar2) {
    uVar7 = *puVar4;
    do {
      uVar1 = *puVar6;
      bVar8 = uVar7 < uVar1;
      if (uVar7 <= uVar1) {
        uVar7 = uVar1;
      }
      if (bVar8) {
        puVar4 = puVar6;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  this->n_mother_rows = (ulong)(*puVar4 + 1);
  this->n_cols = ((long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  compute_mother_pos_varn<unsigned_int>(&this->mother_pos_varn,colptr,rowIdx);
  puVar3 = (rows_to_combine_rate_adapt->
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_ra_rows = 0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = (long)(this->rows_to_combine).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->rows_to_combine).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar5 & 4) == 0) {
    if ((ulong)initial_row_combs <= (ulong)((long)uVar5 >> 2) >> 1) {
      recompute_pos_vn_cn(this,(ulong)initial_row_combs);
      return;
    }
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this_00,
               "The number of desired initial row combinations for rate adaption is larger than the given array of lines to combine."
              );
  }
  else {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this_00,
               "The number of rows to combine for rate adaption (size of argument array) is an odd number (expected even)."
              );
  }
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

RateAdaptiveCode(std::vector<colptr_t> colptr,
                         std::vector<idx_t> rowIdx,
                         std::vector<idx_t> rows_to_combine_rate_adapt,
                         idx_t initial_row_combs = 0)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine(std::move(rows_to_combine_rate_adapt)) {
            if (rows_to_combine.size() % 2 != 0) {
                throw std::domain_error("The number of rows to combine for rate adaption "
                                        "(size of argument array) is an odd number (expected even).");
            }

            if (initial_row_combs > rows_to_combine.size() / 2) {
                throw std::domain_error("The number of desired initial row combinations for rate adaption "
                                        "is larger than the given array of lines to combine.");
            }

            // compute current `pos_varn` and `pos_checkn` from `mother_pos_varn`
            recompute_pos_vn_cn(initial_row_combs);
        }